

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::StdGrammarStackElement::ShiftToken
          (StdGrammarStackElement *this,TokenType *token,
          TokenStream<SGParser::Generator::StdGrammarToken> *stream)

{
  CodeType CVar1;
  String *pSVar2;
  ulong uVar3;
  char *pcVar4;
  long local_38;
  size_t i;
  TokenStream<SGParser::Generator::StdGrammarToken> *stream_local;
  TokenType *token_local;
  StdGrammarStackElement *this_local;
  
  this->Line = token->Line;
  this->Offset = token->Offset;
  if ((this->field_1).pData != (void *)0x0) {
    __assert_fail("pData == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                  ,0x1d2,
                  "void SGParser::Generator::StdGrammarStackElement::ShiftToken(TokenType &, TokenStream<TokenType> &)"
                 );
  }
  CVar1 = (token->super_TokenCode).Code;
  if ((CVar1 == 3) || (CVar1 == 5)) {
    pSVar2 = (String *)operator_new(0x20);
    std::__cxx11::string::string((string *)pSVar2,(string *)&token->Str);
    (this->field_1).pString = pSVar2;
    this->Type = 0x20000000;
  }
  else if (CVar1 == 0x22) {
    pSVar2 = (String *)operator_new(0x20);
    std::__cxx11::string::string((string *)pSVar2);
    (this->field_1).pString = pSVar2;
    this->Type = 0x20000000;
    for (local_38 = 1; uVar3 = std::__cxx11::string::size(), local_38 + 1U < uVar3;
        local_38 = local_38 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&token->Str);
      if ((*pcVar4 == '\'') &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&token->Str), *pcVar4 == '\'')) {
        local_38 = local_38 + 1;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&token->Str);
      std::__cxx11::string::operator+=((string *)(this->field_1).pString,*pcVar4);
    }
  }
  else {
    (this->field_1).pData = (void *)0x0;
    this->Type = 0;
  }
  return;
}

Assistant:

void ShiftToken(TokenType& token, [[maybe_unused]] TokenStream<TokenType>& stream) {
        // Always get the line and offset
        Line   = token.Line;
        Offset = token.Offset;
        SG_ASSERT(pData == nullptr);

        switch (token.Code) {
            case SGL_number_int:
            case SGL_identifier:
                pString = new String{token.Str};
                Type    = DataString;
                break;

            case SGL_quote_cons: {
                pString = new String;
                Type    = DataString;

                // Turn double '' to single ones
                // Copy the String but not the first and last quote characters
                for (size_t i = 1u; i + 1u < token.Str.size(); ++i) {
                    if (token.Str[i] == '\'' && token.Str[i + 1u] == '\'')
                        ++i;
                    *pString += token.Str[i];
                }
                break;
            }

            default:
                pData = nullptr;
                Type  = DataEmpty;
                break;
        }
    }